

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_file_get_comment.c
# Opt level: O0

char * zip_file_get_comment(zip_t *za,zip_uint64_t idx,zip_uint32_t *lenp,zip_flags_t flags)

{
  zip_uint8_t *str;
  zip_dirent_t *pzStack_38;
  zip_uint32_t len;
  zip_dirent_t *de;
  zip_uint32_t *pzStack_28;
  zip_flags_t flags_local;
  zip_uint32_t *lenp_local;
  zip_uint64_t idx_local;
  zip_t *za_local;
  
  de._4_4_ = flags;
  pzStack_28 = lenp;
  lenp_local = (zip_uint32_t *)idx;
  idx_local = (zip_uint64_t)za;
  pzStack_38 = _zip_get_dirent(za,idx,flags,(zip_error_t *)0x0);
  if (pzStack_38 == (zip_dirent_t *)0x0) {
    za_local = (zip_t *)0x0;
  }
  else {
    za_local = (zip_t *)_zip_string_get(pzStack_38->comment,(zip_uint32_t *)((long)&str + 4),
                                        de._4_4_,(zip_error_t *)(idx_local + 0x10));
    if (za_local == (zip_t *)0x0) {
      za_local = (zip_t *)0x0;
    }
    else if (pzStack_28 != (zip_uint32_t *)0x0) {
      *pzStack_28 = str._4_4_;
    }
  }
  return (char *)za_local;
}

Assistant:

ZIP_EXTERN const char *
zip_file_get_comment(zip_t *za, zip_uint64_t idx, zip_uint32_t *lenp, zip_flags_t flags) {
    zip_dirent_t *de;
    zip_uint32_t len;
    const zip_uint8_t *str;

    if ((de = _zip_get_dirent(za, idx, flags, NULL)) == NULL)
	return NULL;

    if ((str = _zip_string_get(de->comment, &len, flags, &za->error)) == NULL)
	return NULL;

    if (lenp)
	*lenp = len;

    return (const char *)str;
}